

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task.hpp
# Opt level: O0

Task * __thiscall
tf::Task::precede<tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&,tf::Task&>
          (Task *this,Task *tasks,Task *tasks_1,Task *tasks_2,Task *tasks_3,Task *tasks_4,
          Task *tasks_5)

{
  Node *in_RDX;
  Node *in_RSI;
  Task *in_RDI;
  
  Node::_precede(in_RSI,in_RDX);
  Node::_precede(in_RSI,in_RDX);
  Node::_precede(in_RSI,in_RDX);
  Node::_precede(in_RSI,in_RDX);
  Node::_precede(in_RSI,in_RDX);
  Node::_precede(in_RSI,in_RDX);
  return in_RDI;
}

Assistant:

Task& Task::precede(Ts&&... tasks) {
  (_node->_precede(tasks._node), ...);
  //_precede(std::forward<Ts>(tasks)...);
  return *this;
}